

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

_Bool do_end_block_check(block_split_stats *stats,u32 block_length)

{
  int *piVar1;
  u32 uVar2;
  u32 uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar2 = stats->num_observations;
  if (uVar2 != 0) {
    uVar3 = stats->num_new_observations;
    iVar4 = 0;
    lVar5 = -10;
    do {
      uVar6 = stats->observations[lVar5 + 10] * uVar3;
      uVar8 = stats->observations[lVar5] * uVar2;
      iVar7 = uVar6 - uVar8;
      if (uVar6 < uVar8) {
        iVar7 = -(uVar6 - uVar8);
      }
      iVar4 = iVar4 + iVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
    uVar6 = (uVar3 * 200 >> 9) * uVar2;
    if (uVar3 + uVar2 < 0x2000 && block_length < 10000) {
      uVar6 = (int)((ulong)(0x2000 - (uVar3 + uVar2)) * (ulong)uVar6 >> 0xd) + uVar6;
    }
    if (uVar6 <= iVar4 + uVar2 * (block_length >> 0xc)) {
      return true;
    }
  }
  lVar5 = -0x28;
  do {
    piVar1 = (int *)((long)stats->observations + lVar5 + 0x28);
    *piVar1 = *piVar1 + *(int *)((long)stats->observations + lVar5);
    *(undefined4 *)((long)stats->observations + lVar5) = 0;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0);
  stats->num_observations = stats->num_observations + stats->num_new_observations;
  stats->num_new_observations = 0;
  return false;
}

Assistant:

static bool
do_end_block_check(struct block_split_stats *stats, u32 block_length)
{
	if (stats->num_observations > 0) {
		/*
		 * Compute the sum of absolute differences of probabilities.  To
		 * avoid needing to use floating point arithmetic or do slow
		 * divisions, we do all arithmetic with the probabilities
		 * multiplied by num_observations * num_new_observations.  E.g.,
		 * for the "old" observations the probabilities would be
		 * (double)observations[i] / num_observations, but since we
		 * multiply by both num_observations and num_new_observations we
		 * really do observations[i] * num_new_observations.
		 */
		u32 total_delta = 0;
		u32 num_items;
		u32 cutoff;
		int i;

		for (i = 0; i < NUM_OBSERVATION_TYPES; i++) {
			u32 expected = stats->observations[i] *
				       stats->num_new_observations;
			u32 actual = stats->new_observations[i] *
				     stats->num_observations;
			u32 delta = (actual > expected) ? actual - expected :
							  expected - actual;

			total_delta += delta;
		}

		num_items = stats->num_observations +
			    stats->num_new_observations;
		/*
		 * Heuristic: the cutoff is when the sum of absolute differences
		 * of probabilities becomes at least 200/512.  As above, the
		 * probability is multiplied by both num_new_observations and
		 * num_observations.  Be careful to avoid integer overflow.
		 */
		cutoff = stats->num_new_observations * 200 / 512 *
			 stats->num_observations;
		/*
		 * Very short blocks have a lot of overhead for the Huffman
		 * codes, so only use them if it clearly seems worthwhile.
		 * (This is an additional penalty, which adds to the smaller
		 * penalty below which scales more slowly.)
		 */
		if (block_length < 10000 && num_items < 8192)
			cutoff += (u64)cutoff * (8192 - num_items) / 8192;

		/* Ready to end the block? */
		if (total_delta +
		    (block_length / 4096) * stats->num_observations >= cutoff)
			return true;
	}
	merge_new_observations(stats);
	return false;
}